

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O1

void __thiscall
Assimp::SplitByBoneCountProcess::Execute(SplitByBoneCountProcess *this,aiScene *pScene)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  pointer *ppuVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  iterator iVar3;
  aiMesh *paVar4;
  Logger *pLVar5;
  aiMesh **__dest;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiMesh *srcMesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> newMeshes;
  uint local_1ec;
  void *local_1e8;
  iterator iStack_1e0;
  aiMesh **local_1d8;
  aiMesh *local_1d0 [2];
  undefined1 local_1c0 [24];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_1a8 [4];
  ios_base local_138 [264];
  
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"SplitByBoneCountProcess begin");
  if ((ulong)pScene->mNumMeshes == 0) {
    bVar6 = false;
  }
  else {
    uVar7 = 0;
    bVar6 = false;
    do {
      if (this->mMaxBoneCount < (ulong)pScene->mMeshes[uVar7]->mNumBones) {
        bVar6 = true;
      }
      uVar7 = uVar7 + 1;
    } while (pScene->mNumMeshes != uVar7);
  }
  if (bVar6) {
    this_00 = &this->mSubMeshIndices;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::clear(this_00);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(this_00,(ulong)pScene->mNumMeshes);
    local_1e8 = (void *)0x0;
    iStack_1e0._M_current = (aiMesh **)0x0;
    local_1d8 = (aiMesh **)0x0;
    if (pScene->mNumMeshes != 0) {
      uVar7 = 0;
      local_1c0._16_8_ = pScene;
      do {
        local_1d0[0] = pScene->mMeshes[uVar7];
        local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SplitMesh(this,pScene->mMeshes[uVar7],local_1a8);
        if (local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pvVar2 = (this_00->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar7;
          local_1ec = (uint)((ulong)((long)iStack_1e0._M_current - (long)local_1e8) >> 3);
          iVar3._M_current =
               (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(pvVar2,iVar3,&local_1ec);
          }
          else {
            *iVar3._M_current = local_1ec;
            ppuVar1 = &(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          if (iStack_1e0._M_current == local_1d8) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_1e8,iStack_1e0,local_1d0);
          }
          else {
            *iStack_1e0._M_current = local_1d0[0];
            iStack_1e0._M_current = iStack_1e0._M_current + 1;
          }
        }
        else {
          if (local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar8 = 0;
            uVar9 = 1;
            do {
              pvVar2 = (this_00->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar7;
              local_1ec = (uint)((ulong)((long)iStack_1e0._M_current - (long)local_1e8) >> 3);
              iVar3._M_current =
                   (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>(pvVar2,iVar3,&local_1ec);
              }
              else {
                *iVar3._M_current = local_1ec;
                ppuVar1 = &(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              if (iStack_1e0._M_current == local_1d8) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_1e8,iStack_1e0,
                           (aiMesh **)
                           ((float *)local_1a8[0].
                                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                     .super__Vector_impl_data._M_start + uVar8 * 2));
              }
              else {
                *iStack_1e0._M_current =
                     *(aiMesh **)
                      ((float *)local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar8 * 2);
                iStack_1e0._M_current = iStack_1e0._M_current + 1;
              }
              bVar6 = uVar9 < (ulong)((long)local_1a8[0].
                                            super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_1a8[0].
                                            super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3);
              uVar8 = uVar9;
              uVar9 = (ulong)((int)uVar9 + 1);
            } while (bVar6);
          }
          pScene = (aiScene *)local_1c0._16_8_;
          paVar4 = local_1d0[0];
          if (local_1d0[0] != (aiMesh *)0x0) {
            aiMesh::~aiMesh(local_1d0[0]);
            operator_delete(paVar4);
          }
        }
        if ((aiVector3D *)
            local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start != (aiVector3D *)0x0) {
          operator_delete(local_1a8[0].super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < pScene->mNumMeshes);
    }
    pScene->mNumMeshes = (uint)((ulong)((long)iStack_1e0._M_current - (long)local_1e8) >> 3);
    if (pScene->mMeshes != (aiMesh **)0x0) {
      operator_delete__(pScene->mMeshes);
    }
    __dest = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
    pScene->mMeshes = __dest;
    if ((long)iStack_1e0._M_current - (long)local_1e8 != 0) {
      memmove(__dest,local_1e8,(long)iStack_1e0._M_current - (long)local_1e8);
    }
    UpdateNode(this,pScene->mRootNode);
    pLVar5 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"SplitByBoneCountProcess end: split ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," meshes into ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," submeshes.",0xb);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar5,(char *)local_1d0[0]);
    if (local_1d0[0] != (aiMesh *)local_1c0) {
      operator_delete(local_1d0[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_1e8 != (void *)0x0) {
      operator_delete(local_1e8);
    }
  }
  else {
    pLVar5 = DefaultLogger::get();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"SplitByBoneCountProcess early-out: no meshes with more than ",
               0x3c);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," bones.",7);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar5,(char *)local_1d0[0]);
    if (local_1d0[0] != (aiMesh *)local_1c0) {
      operator_delete(local_1d0[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("SplitByBoneCountProcess begin");

    // early out
    bool isNecessary = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
        if( pScene->mMeshes[a]->mNumBones > mMaxBoneCount )
            isNecessary = true;

    if( !isNecessary )
    {
        ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess early-out: no meshes with more than " << mMaxBoneCount << " bones." );
        return;
    }

    // we need to do something. Let's go.
    mSubMeshIndices.clear();
    mSubMeshIndices.resize( pScene->mNumMeshes);

    // build a new array of meshes for the scene
    std::vector<aiMesh*> meshes;

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a)
    {
        aiMesh* srcMesh = pScene->mMeshes[a];

        std::vector<aiMesh*> newMeshes;
        SplitMesh( pScene->mMeshes[a], newMeshes);

        // mesh was split
        if( !newMeshes.empty() )
        {
            // store new meshes and indices of the new meshes
            for( unsigned int b = 0; b < newMeshes.size(); ++b)
            {
                mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
                meshes.push_back( newMeshes[b]);
            }

            // and destroy the source mesh. It should be completely contained inside the new submeshes
            delete srcMesh;
        }
        else
        {
            // Mesh is kept unchanged - store it's new place in the mesh array
            mSubMeshIndices[a].push_back( static_cast<unsigned int>(meshes.size()));
            meshes.push_back( srcMesh);
        }
    }

    // rebuild the scene's mesh array
    pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
    delete [] pScene->mMeshes;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

    // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
    UpdateNode( pScene->mRootNode);

    ASSIMP_LOG_DEBUG( format() << "SplitByBoneCountProcess end: split " << mSubMeshIndices.size() << " meshes into " << meshes.size() << " submeshes." );
}